

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBuiltinPrecisionTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles31::Functional::createBuiltinPrecisionTests(Context *context)

{
  undefined1 *this;
  TestCaseGroup *this_00;
  TestContext *pTVar1;
  RenderContext *pRVar2;
  CaseFactories *pCVar3;
  value_type local_70 [4];
  undefined1 local_60 [8];
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  es31Cases;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  es3Cases;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> shaderTypes;
  TestCaseGroup *group;
  Context *context_local;
  
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this_00,context,"precision","Builtin precision tests");
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::vector
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8);
  gls::BuiltinPrecisionTests::createES3BuiltinCases();
  gls::BuiltinPrecisionTests::createES31BuiltinCases();
  local_70[3] = 5;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8,local_70 + 3);
  pTVar1 = Context::getTestContext(context);
  pRVar2 = Context::getRenderContext(context);
  pCVar3 = de::details::
           UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
           ::operator*((UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
                        *)&es31Cases.
                           super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
                           .m_data.field_0x8);
  gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
            (pTVar1,pRVar2,pCVar3,
             (vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8,(TestCaseGroup *)this_00);
  this = &es3Cases.
          super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
          .m_data.field_0x8;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::clear
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)this);
  local_70[2] = 0;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)this,local_70 + 2);
  local_70[1] = 1;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8,local_70 + 1);
  local_70[0] = SHADERTYPE_COMPUTE;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8,local_70);
  pTVar1 = Context::getTestContext(context);
  pRVar2 = Context::getRenderContext(context);
  pCVar3 = de::details::
           UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
           ::operator*((UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
                        *)local_60);
  gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
            (pTVar1,pRVar2,pCVar3,
             (vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8,(TestCaseGroup *)this_00);
  de::details::
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ::~MovePtr((MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              *)local_60);
  de::details::
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ::~MovePtr((MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              *)&es31Cases.
                 super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
                 .m_data.field_0x8);
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::~vector
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8);
  return this_00;
}

Assistant:

TestCaseGroup* createBuiltinPrecisionTests (Context& context)
{
	TestCaseGroup*							group		= new TestCaseGroup(
		context, "precision", "Builtin precision tests");
	std::vector<glu::ShaderType>			shaderTypes;
	de::MovePtr<const bpt::CaseFactories>	es3Cases		= bpt::createES3BuiltinCases();
	de::MovePtr<const bpt::CaseFactories>	es31Cases		= bpt::createES31BuiltinCases();

	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	bpt::addBuiltinPrecisionTests(context.getTestContext(),
								  context.getRenderContext(),
								  *es3Cases,
								  shaderTypes,
								  *group);

	shaderTypes.clear();
	shaderTypes.push_back(glu::SHADERTYPE_VERTEX);
	shaderTypes.push_back(glu::SHADERTYPE_FRAGMENT);
	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	bpt::addBuiltinPrecisionTests(context.getTestContext(),
								  context.getRenderContext(),
								  *es31Cases,
								  shaderTypes,
								  *group);
	return group;
}